

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::OnSelect(TypeChecker *this,Type expected)

{
  Type TVar1;
  Result RVar2;
  Result RVar3;
  Result RVar4;
  Type args;
  bool bVar5;
  bool bVar6;
  Type type2;
  Type type1;
  
  _type2 = 0;
  RVar2 = PeekAndCheckType(this,0,(Type)0xffffffff);
  RVar3 = PeekType(this,1,&type1);
  RVar4 = PeekType(this,2,&type2);
  bVar5 = RVar4.enum_ == Error || (RVar3.enum_ == Error || RVar2.enum_ == Error);
  TVar1.enum_ = type1.enum_;
  if (expected.enum_ == Any) {
    bVar6 = true;
    if ((0x1a < (uint)(type1.enum_ + ~(Func|I32U))) ||
       ((0x40001c1U >> (type1.enum_ + ~(Func|I32U) & 0x1fU) & 1) == 0)) {
      if ((0x1a < (uint)(type2.enum_ + ~(Func|I32U))) ||
         (args.enum_ = Any, (0x40001c1U >> (type2.enum_ + ~(Func|I32U) & 0x1fU) & 1) == 0)) {
        RVar2 = CheckType(type1,type2);
        bVar6 = bVar5 || RVar2.enum_ == Error;
        args.enum_ = TVar1.enum_;
      }
      goto LAB_00189a30;
    }
  }
  else {
    RVar2 = CheckType(type1,expected);
    RVar3 = CheckType(type2,expected);
    bVar6 = bVar5 || (RVar3.enum_ == Error || RVar2.enum_ == Error);
  }
  args.enum_ = Any;
LAB_00189a30:
  RVar2.enum_._1_3_ = 0;
  RVar2.enum_._0_1_ = bVar6;
  PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type::Enum>(this,RVar2,"select",args,args,I32);
  RVar2 = DropTypes(this,3);
  PushType(this,args);
  return (Result)(uint)(byte)(bVar6 | RVar2.enum_ == Error);
}

Assistant:

Result TypeChecker::OnSelect(Type expected) {
  Result result = Result::Ok;
  Type type1 = Type::Any;
  Type type2 = Type::Any;
  Type result_type = Type::Any;
  result |= PeekAndCheckType(0, Type::I32);
  result |= PeekType(1, &type1);
  result |= PeekType(2, &type2);
  if (expected == Type::Any) {
    if (type1.IsRef() || type2.IsRef()) {
      result = Result::Error;
    } else {
      result |= CheckType(type1, type2);
      result_type = type1;
    }
  } else {
    result |= CheckType(type1, expected);
    result |= CheckType(type2, expected);
  }
  PrintStackIfFailed(result, "select", result_type, result_type, Type::I32);
  result |= DropTypes(3);
  PushType(result_type);
  return result;
}